

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMeshFragment::CopyFrom
          (ON_SubDMeshFragment *this,ON_SubDMeshFragment *src_fragment,uint display_density)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  size_t sVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_3dVector quad_normal_00;
  unsigned_short uVar11;
  bool bVar12;
  uint i;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar16;
  double *pdVar17;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar18;
  ON_SurfaceCurvature *pOVar19;
  int iVar20;
  uint uVar21;
  double *pdVar22;
  double *pdVar23;
  ON_SurfaceCurvature *pOVar24;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar25;
  ON_SurfaceCurvature *pOVar26;
  ulong uVar27;
  uint uVar28;
  uint i_2;
  uint uVar29;
  uint uVar30;
  ulong vertex_capacity;
  ON_SubDMeshFragmentGrid grid;
  ON_3dVector quad_normal;
  ON_3dPoint quad_points [4];
  ulong uVar31;
  
  if (this == src_fragment) {
    return true;
  }
  Clear(this);
  this->m_face = src_fragment->m_face;
  this->m_face_vertex_index[0] = src_fragment->m_face_vertex_index[0];
  this->m_face_vertex_index[1] = src_fragment->m_face_vertex_index[1];
  this->m_face_vertex_index[2] = src_fragment->m_face_vertex_index[2];
  this->m_face_vertex_index[3] = src_fragment->m_face_vertex_index[3];
  uVar11 = src_fragment->m_face_fragment_index;
  this->m_face_fragment_count = src_fragment->m_face_fragment_count;
  this->m_face_fragment_index = uVar11;
  bVar12 = GetControlNetQuad(src_fragment,false,quad_points,&quad_normal);
  if (bVar12) {
    quad_normal_00.y = quad_normal.y;
    quad_normal_00.x = quad_normal.x;
    quad_normal_00.z = quad_normal.z;
    SetControlNetQuad(this,false,quad_points,quad_normal_00);
  }
  bVar12 = TextureCoordinatesExistForExperts(src_fragment);
  if (bVar12) {
    this->m_ctrlnetT[0][0] = src_fragment->m_ctrlnetT[0][0];
    this->m_ctrlnetT[0][1] = src_fragment->m_ctrlnetT[0][1];
    this->m_ctrlnetT[0][2] = src_fragment->m_ctrlnetT[0][2];
    this->m_ctrlnetT[1][0] = src_fragment->m_ctrlnetT[1][0];
    this->m_ctrlnetT[1][1] = src_fragment->m_ctrlnetT[1][1];
    this->m_ctrlnetT[1][2] = src_fragment->m_ctrlnetT[1][2];
    this->m_ctrlnetT[2][0] = src_fragment->m_ctrlnetT[2][0];
    this->m_ctrlnetT[2][1] = src_fragment->m_ctrlnetT[2][1];
    this->m_ctrlnetT[2][2] = src_fragment->m_ctrlnetT[2][2];
    this->m_ctrlnetT[3][0] = src_fragment->m_ctrlnetT[3][0];
    this->m_ctrlnetT[3][1] = src_fragment->m_ctrlnetT[3][1];
    this->m_ctrlnetT[3][2] = src_fragment->m_ctrlnetT[3][2];
  }
  uVar3 = src_fragment->m_vertex_capacity_etc;
  if ((uVar3 >> 0xe & 1) != 0) {
    dVar6 = src_fragment->m_ctrlnetK[0].k2;
    this->m_ctrlnetK[0].k1 = src_fragment->m_ctrlnetK[0].k1;
    this->m_ctrlnetK[0].k2 = dVar6;
    dVar6 = src_fragment->m_ctrlnetK[1].k2;
    this->m_ctrlnetK[1].k1 = src_fragment->m_ctrlnetK[1].k1;
    this->m_ctrlnetK[1].k2 = dVar6;
    dVar6 = src_fragment->m_ctrlnetK[2].k2;
    this->m_ctrlnetK[2].k1 = src_fragment->m_ctrlnetK[2].k1;
    this->m_ctrlnetK[2].k2 = dVar6;
    dVar6 = src_fragment->m_ctrlnetK[3].k2;
    this->m_ctrlnetK[3].k1 = src_fragment->m_ctrlnetK[3].k1;
    this->m_ctrlnetK[3].k2 = dVar6;
    uVar3 = src_fragment->m_vertex_capacity_etc;
  }
  if ((uVar3 >> 0xd & 1) != 0) {
    this->m_ctrlnetC[0].field_0 = src_fragment->m_ctrlnetC[0].field_0;
    this->m_ctrlnetC[1].field_0 = src_fragment->m_ctrlnetC[1].field_0;
    this->m_ctrlnetC[2].field_0 = src_fragment->m_ctrlnetC[2].field_0;
    this->m_ctrlnetC[3].field_0 = src_fragment->m_ctrlnetC[3].field_0;
  }
  this->m_pack_rect[0][0] = src_fragment->m_pack_rect[0][0];
  this->m_pack_rect[0][1] = src_fragment->m_pack_rect[0][1];
  this->m_pack_rect[1][0] = src_fragment->m_pack_rect[1][0];
  this->m_pack_rect[1][1] = src_fragment->m_pack_rect[1][1];
  this->m_pack_rect[2][0] = src_fragment->m_pack_rect[2][0];
  this->m_pack_rect[2][1] = src_fragment->m_pack_rect[2][1];
  this->m_pack_rect[3][0] = src_fragment->m_pack_rect[3][0];
  this->m_pack_rect[3][1] = src_fragment->m_pack_rect[3][1];
  if (0xfffffff7 < display_density - 7) {
    uVar29 = src_fragment->m_vertex_count_etc & 0x1fff;
    uVar15 = (ulong)uVar29;
    if ((src_fragment->m_vertex_count_etc & 0x1fff) != 0) {
      bVar2 = (src_fragment->m_grid).m_side_segment_count;
      iVar20 = bVar2 + 1;
      uVar21 = iVar20 * iVar20;
      if (bVar2 == 0) {
        uVar21 = 0;
      }
      if ((uVar21 == uVar29) && (uVar21 = PointCount(src_fragment), uVar21 == uVar29)) {
        if (display_density == 0xffffffff) {
          grid.m_reserved1 = (src_fragment->m_grid).m_reserved1;
          grid.m_reserved2 = (src_fragment->m_grid).m_reserved2;
          grid.m_side_segment_count = (src_fragment->m_grid).m_side_segment_count;
          grid.m_reserved3 = (src_fragment->m_grid).m_reserved3;
          grid.m_F_count = (src_fragment->m_grid).m_F_count;
          grid.m_F_level_of_detail = (src_fragment->m_grid).m_F_level_of_detail;
          grid.m_F_stride = (src_fragment->m_grid).m_F_stride;
          grid.m_reserved4 = (src_fragment->m_grid).m_reserved4;
          grid.m_reserved5 = (src_fragment->m_grid).m_reserved5;
          grid.m_F = (src_fragment->m_grid).m_F;
          grid.m_S = (src_fragment->m_grid).m_S;
          grid.m_prev_level_of_detail = (src_fragment->m_grid).m_prev_level_of_detail;
          grid.m_next_level_of_detail = (src_fragment->m_grid).m_next_level_of_detail;
        }
        else {
          ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(&grid,display_density,0);
        }
        uVar14 = (uint)grid.m_side_segment_count;
        uVar21 = (grid.m_side_segment_count + 1) * (grid.m_side_segment_count + 1);
        if (grid.m_side_segment_count == '\0') {
          uVar21 = (uint)grid.m_side_segment_count;
        }
        uVar13 = this->m_vertex_capacity_etc & 0x1fff;
        vertex_capacity = (ulong)uVar21;
        if (uVar13 < uVar21) {
          bVar12 = ReserveManagedVertexCapacity(this,vertex_capacity);
          if (!bVar12) goto LAB_0060af4b;
          uVar13 = this->m_vertex_capacity_etc & 0x1fff;
        }
        if ((uVar21 <= uVar13) && (uVar21 <= (src_fragment->m_vertex_count_etc & 0x1fff))) {
          (this->m_grid).m_prev_level_of_detail = grid.m_prev_level_of_detail;
          (this->m_grid).m_next_level_of_detail = grid.m_next_level_of_detail;
          (this->m_grid).m_F = grid.m_F;
          (this->m_grid).m_S = grid.m_S;
          (this->m_grid).m_reserved1 = grid.m_reserved1;
          (this->m_grid).m_reserved2 = grid.m_reserved2;
          (this->m_grid).m_side_segment_count = grid.m_side_segment_count;
          (this->m_grid).m_reserved3 = grid.m_reserved3;
          (this->m_grid).m_F_count = grid.m_F_count;
          (this->m_grid).m_F_level_of_detail = grid.m_F_level_of_detail;
          (this->m_grid).m_F_stride = grid.m_F_stride;
          (this->m_grid).m_reserved4 = grid.m_reserved4;
          (this->m_grid).m_reserved5 = grid.m_reserved5;
          pdVar17 = this->m_P;
          sVar4 = this->m_P_stride;
          pdVar23 = src_fragment->m_P;
          sVar5 = src_fragment->m_P_stride;
          if (uVar21 == uVar29) {
            uVar21 = PointCapacity(this);
            if (uVar29 <= uVar21) {
              pdVar22 = pdVar23 + sVar5 * uVar15;
              pdVar17 = pdVar17 + 2;
              for (; pdVar23 < pdVar22; pdVar23 = pdVar23 + sVar5) {
                pdVar17[-2] = *pdVar23;
                pdVar17[-1] = pdVar23[1];
                *pdVar17 = pdVar23[2];
                pdVar17 = pdVar17 + sVar4;
              }
              dVar6 = (src_fragment->m_surface_bbox).m_min.x;
              dVar7 = (src_fragment->m_surface_bbox).m_min.y;
              dVar8 = (src_fragment->m_surface_bbox).m_min.z;
              dVar9 = (src_fragment->m_surface_bbox).m_max.x;
              dVar10 = (src_fragment->m_surface_bbox).m_max.z;
              (this->m_surface_bbox).m_max.y = (src_fragment->m_surface_bbox).m_max.y;
              (this->m_surface_bbox).m_max.z = dVar10;
              (this->m_surface_bbox).m_min.z = dVar8;
              (this->m_surface_bbox).m_max.x = dVar9;
              (this->m_surface_bbox).m_min.x = dVar6;
              (this->m_surface_bbox).m_min.y = dVar7;
            }
            uVar21 = NormalCapacity(this);
            uVar31 = (ulong)(ushort)uVar29;
            if (uVar29 <= uVar21) {
              uVar21 = NormalCount(src_fragment);
              if (uVar21 == uVar29) {
                sVar4 = this->m_N_stride;
                pdVar23 = src_fragment->m_N;
                sVar5 = src_fragment->m_N_stride;
                pdVar17 = pdVar23 + sVar5 * uVar15;
                pdVar22 = this->m_N + 2;
                for (; pdVar23 < pdVar17; pdVar23 = pdVar23 + sVar5) {
                  pdVar22[-2] = *pdVar23;
                  pdVar22[-1] = pdVar23[1];
                  *pdVar22 = pdVar23[2];
                  pdVar22 = pdVar22 + sVar4;
                }
              }
              else {
                Internal_Set3dPointArrayToNan(this->m_N,uVar31,this->m_N_stride);
              }
            }
            uVar21 = TextureCoordinateCapacity(this);
            if (uVar29 <= uVar21) {
              uVar21 = TextureCoordinateCount(src_fragment);
              if (uVar21 == uVar29) {
                SetTextureCoordinatesExistForExperts(this,true);
                sVar4 = this->m_T_stride;
                pdVar23 = src_fragment->m_T;
                sVar5 = src_fragment->m_T_stride;
                pdVar17 = pdVar23 + sVar5 * uVar15;
                pdVar22 = this->m_T + 2;
                for (; pdVar23 < pdVar17; pdVar23 = pdVar23 + sVar5) {
                  pdVar22[-2] = *pdVar23;
                  pdVar22[-1] = pdVar23[1];
                  *pdVar22 = pdVar23[2];
                  pdVar22 = pdVar22 + sVar4;
                }
              }
              else {
                Internal_Set3dPointArrayToNan(this->m_T,uVar31,this->m_T_stride);
              }
            }
            uVar21 = CurvatureCapacity(this);
            if (uVar29 <= uVar21) {
              uVar21 = CurvatureCount(src_fragment);
              if (uVar21 == uVar29) {
                pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
                *pbVar1 = *pbVar1 | 0x40;
                pOVar19 = this->m_K;
                sVar4 = this->m_K_stride;
                pOVar24 = src_fragment->m_K;
                sVar5 = src_fragment->m_K_stride;
                pOVar26 = pOVar24 + sVar5 * uVar15;
                for (; pOVar24 < pOVar26; pOVar24 = pOVar24 + sVar5) {
                  dVar6 = pOVar24->k2;
                  pOVar19->k1 = pOVar24->k1;
                  pOVar19->k2 = dVar6;
                  pOVar19 = pOVar19 + sVar4;
                }
              }
              else {
                pOVar19 = this->m_K;
                pOVar24 = pOVar19 + this->m_K_stride * uVar31;
                for (; dVar6 = ON_SurfaceCurvature::Nan.k2, pOVar19 < pOVar24;
                    pOVar19 = pOVar19 + this->m_K_stride) {
                  pOVar19->k1 = ON_SurfaceCurvature::Nan.k1;
                  pOVar19->k2 = dVar6;
                }
              }
            }
            uVar21 = ColorCapacity(this);
            if (uVar29 <= uVar21) {
              uVar21 = ColorCount(src_fragment);
              if (uVar21 == uVar29) {
                pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
                *pbVar1 = *pbVar1 | 0x20;
                paVar16 = &this->m_C->field_0;
                sVar4 = this->m_C_stride;
                paVar25 = &src_fragment->m_C->field_0;
                sVar5 = src_fragment->m_C_stride;
                paVar18 = paVar25 + uVar15 * sVar5;
                for (; paVar25 < paVar18; paVar25 = paVar25 + sVar5) {
                  *paVar16 = *paVar25;
                  paVar16 = paVar16 + sVar4;
                }
              }
              else {
                paVar16 = &this->m_C->field_0;
                paVar18 = paVar16 + uVar31 * this->m_C_stride;
                for (; paVar16 < paVar18; paVar16 = paVar16 + this->m_C_stride) {
                  *paVar16 = ON_Color::UnsetColor.field_0;
                }
              }
            }
          }
          else {
            bVar2 = (src_fragment->m_grid).m_side_segment_count;
            uVar29 = 1;
            do {
              uVar13 = uVar29;
              uVar29 = uVar13 * 2;
            } while (uVar13 * uVar14 < (uint)bVar2);
            uVar29 = bVar2 + 1;
            if (bVar2 == 0) {
              uVar29 = (uint)bVar2;
            }
            uVar14 = -(uint)(bVar2 == 0);
            uVar30 = uVar13 | uVar14;
            uVar31 = (ulong)uVar30;
            uVar14 = uVar14 | (bVar2 + 1) * uVar13;
            uVar15 = (ulong)(uVar14 * uVar29);
            uVar13 = PointCapacity(this);
            if (uVar21 <= uVar13) {
              for (uVar27 = 0; (uint)uVar27 < uVar29; uVar27 = (ulong)((uint)uVar27 + uVar14)) {
                pdVar22 = (double *)((long)pdVar23 + uVar27 * sVar5 * uVar15 * 8 + 0x10);
                for (uVar13 = 0; uVar13 < uVar29; uVar13 = uVar13 + uVar30) {
                  *pdVar17 = pdVar22[-2];
                  pdVar17[1] = pdVar22[-1];
                  pdVar17[2] = *pdVar22;
                  pdVar22 = pdVar22 + sVar5 * uVar31;
                  pdVar17 = pdVar17 + sVar4;
                }
              }
              dVar6 = (src_fragment->m_surface_bbox).m_min.x;
              dVar7 = (src_fragment->m_surface_bbox).m_min.y;
              dVar8 = (src_fragment->m_surface_bbox).m_min.z;
              dVar9 = (src_fragment->m_surface_bbox).m_max.x;
              dVar10 = (src_fragment->m_surface_bbox).m_max.z;
              (this->m_surface_bbox).m_max.y = (src_fragment->m_surface_bbox).m_max.y;
              (this->m_surface_bbox).m_max.z = dVar10;
              (this->m_surface_bbox).m_min.z = dVar8;
              (this->m_surface_bbox).m_max.x = dVar9;
              (this->m_surface_bbox).m_min.x = dVar6;
              (this->m_surface_bbox).m_min.y = dVar7;
            }
            uVar13 = NormalCapacity(this);
            if (uVar21 <= uVar13) {
              uVar13 = NormalCount(src_fragment);
              pdVar17 = this->m_N;
              if (uVar13 < uVar21) {
                Internal_Set3dPointArrayToNan(pdVar17,vertex_capacity,this->m_N_stride);
              }
              else {
                sVar4 = this->m_N_stride;
                pdVar23 = src_fragment->m_N;
                sVar5 = src_fragment->m_N_stride;
                for (uVar27 = 0; (uint)uVar27 < uVar29; uVar27 = (ulong)((uint)uVar27 + uVar14)) {
                  pdVar22 = (double *)((long)pdVar23 + uVar27 * sVar5 * uVar15 * 8 + 0x10);
                  for (uVar13 = 0; uVar13 < uVar29; uVar13 = uVar13 + uVar30) {
                    *pdVar17 = pdVar22[-2];
                    pdVar17[1] = pdVar22[-1];
                    pdVar17[2] = *pdVar22;
                    pdVar22 = pdVar22 + sVar5 * uVar31;
                    pdVar17 = pdVar17 + sVar4;
                  }
                }
              }
            }
            uVar13 = TextureCoordinateCapacity(this);
            if (uVar21 <= uVar13) {
              uVar13 = TextureCoordinateCount(src_fragment);
              if (uVar13 < uVar21) {
                Internal_Set3dPointArrayToNan(this->m_T,vertex_capacity,this->m_T_stride);
              }
              else {
                SetTextureCoordinatesExistForExperts(this,true);
                pdVar17 = this->m_T;
                sVar4 = this->m_T_stride;
                pdVar23 = src_fragment->m_T;
                sVar5 = src_fragment->m_T_stride;
                for (uVar27 = 0; (uint)uVar27 < uVar29; uVar27 = (ulong)((uint)uVar27 + uVar14)) {
                  pdVar22 = (double *)((long)pdVar23 + uVar27 * sVar5 * uVar15 * 8 + 0x10);
                  for (uVar13 = 0; uVar13 < uVar29; uVar13 = uVar13 + uVar30) {
                    *pdVar17 = pdVar22[-2];
                    pdVar17[1] = pdVar22[-1];
                    pdVar17[2] = *pdVar22;
                    pdVar22 = pdVar22 + sVar5 * uVar31;
                    pdVar17 = pdVar17 + sVar4;
                  }
                }
              }
            }
            uVar13 = CurvatureCapacity(this);
            if (uVar21 <= uVar13) {
              uVar13 = CurvatureCount(src_fragment);
              if (uVar13 < uVar21) {
                pOVar19 = this->m_K;
                pOVar24 = pOVar19 + this->m_K_stride * vertex_capacity;
                for (; dVar6 = ON_SurfaceCurvature::Nan.k2, pOVar19 < pOVar24;
                    pOVar19 = pOVar19 + this->m_K_stride) {
                  pOVar19->k1 = ON_SurfaceCurvature::Nan.k1;
                  pOVar19->k2 = dVar6;
                }
              }
              else {
                pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
                *pbVar1 = *pbVar1 | 0x40;
                pOVar19 = this->m_K;
                sVar4 = this->m_K_stride;
                sVar5 = src_fragment->m_K_stride;
                for (uVar13 = 0; uVar13 < uVar29; uVar13 = uVar13 + uVar14) {
                  pdVar17 = (double *)
                            ((long)&src_fragment->m_K->k1 + (ulong)uVar13 * sVar5 * uVar15 * 0x10);
                  for (uVar28 = 0; uVar28 < uVar29; uVar28 = uVar28 + uVar30) {
                    dVar6 = pdVar17[1];
                    pOVar19->k1 = *pdVar17;
                    pOVar19->k2 = dVar6;
                    pOVar19 = pOVar19 + sVar4;
                    pdVar17 = pdVar17 + sVar5 * uVar31 * 2;
                  }
                }
              }
            }
            uVar13 = ColorCapacity(this);
            if (uVar21 <= uVar13) {
              uVar13 = ColorCount(src_fragment);
              if (uVar13 < uVar21) {
                paVar16 = &this->m_C->field_0;
                paVar18 = paVar16 + this->m_C_stride * vertex_capacity;
                for (; paVar16 < paVar18; paVar16 = paVar16 + this->m_C_stride) {
                  *paVar16 = ON_Color::UnsetColor.field_0;
                }
              }
              else {
                pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
                *pbVar1 = *pbVar1 | 0x20;
                paVar18 = &this->m_C->field_0;
                sVar4 = this->m_C_stride;
                sVar5 = src_fragment->m_C_stride;
                for (uVar21 = 0; uVar21 < uVar29; uVar21 = uVar21 + uVar14) {
                  paVar16 = (anon_union_4_2_6147a14e_for_ON_Color_15 *)
                            ((long)&src_fragment->m_C->field_0 + (ulong)uVar21 * uVar15 * sVar5 * 4)
                  ;
                  for (uVar13 = 0; uVar13 < uVar29; uVar13 = uVar13 + uVar30) {
                    *paVar18 = *paVar16;
                    paVar18 = paVar18 + sVar4;
                    paVar16 = paVar16 + sVar5 * uVar31;
                  }
                }
              }
            }
          }
          SetVertexCount(this,vertex_capacity);
          return true;
        }
      }
    }
  }
LAB_0060af4b:
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDMeshFragment::CopyFrom(
  const ON_SubDMeshFragment& src_fragment,
  unsigned int display_density
  )
{
  if (this == &src_fragment)
  {
    return true;
  }

  this->Clear();

  m_face = src_fragment.m_face;
  m_face_vertex_index[0] = src_fragment.m_face_vertex_index[0];
  m_face_vertex_index[1] = src_fragment.m_face_vertex_index[1];
  m_face_vertex_index[2] = src_fragment.m_face_vertex_index[2];
  m_face_vertex_index[3] = src_fragment.m_face_vertex_index[3];
  m_face_fragment_count = src_fragment.m_face_fragment_count;
  m_face_fragment_index = src_fragment.m_face_fragment_index;


  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  if (src_fragment.GetControlNetQuad(false, quad_points, quad_normal))
    this->SetControlNetQuad(false, quad_points, quad_normal);

  if (src_fragment.TextureCoordinatesExistForExperts())
  {
    m_ctrlnetT[0][0] = src_fragment.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src_fragment.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src_fragment.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src_fragment.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src_fragment.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src_fragment.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src_fragment.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src_fragment.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src_fragment.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src_fragment.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src_fragment.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src_fragment.m_ctrlnetT[3][2];
  }

  if (src_fragment.CurvaturesExistForExperts())
  {
    m_ctrlnetK[0] = src_fragment.m_ctrlnetK[0];
    m_ctrlnetK[1] = src_fragment.m_ctrlnetK[1];
    m_ctrlnetK[2] = src_fragment.m_ctrlnetK[2];
    m_ctrlnetK[3] = src_fragment.m_ctrlnetK[3];
  }

  if (src_fragment.ColorsExistForExperts())
  {
    m_ctrlnetC[0] = src_fragment.m_ctrlnetC[0];
    m_ctrlnetC[1] = src_fragment.m_ctrlnetC[1];
    m_ctrlnetC[2] = src_fragment.m_ctrlnetC[2];
    m_ctrlnetC[3] = src_fragment.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src_fragment.m_pack_rect[0][0];
  m_pack_rect[0][1] = src_fragment.m_pack_rect[0][1];
  m_pack_rect[1][0] = src_fragment.m_pack_rect[1][0];
  m_pack_rect[1][1] = src_fragment.m_pack_rect[1][1];
  m_pack_rect[2][0] = src_fragment.m_pack_rect[2][0];
  m_pack_rect[2][1] = src_fragment.m_pack_rect[2][1];
  m_pack_rect[3][0] = src_fragment.m_pack_rect[3][0];
  m_pack_rect[3][1] = src_fragment.m_pack_rect[3][1];

  if ( display_density > ON_SubDDisplayParameters::MaximumDensity && ON_UNSET_UINT_INDEX != display_density)
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned src_V_count = src_fragment.VertexCount();
  if ( 0 == src_V_count || src_V_count != src_fragment.m_grid.GridPointCount() )
    return ON_SUBD_RETURN_ERROR(false);

  if (src_V_count != src_fragment.PointCount())
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDMeshFragmentGrid grid
    = (ON_UNSET_UINT_INDEX == display_density)
    ? src_fragment.m_grid
    : ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density,0);
  const unsigned V_count = grid.GridPointCount();
  if (VertexCapacity() < V_count)
  {
    if (false == this->ReserveManagedVertexCapacity(V_count))
      return ON_SUBD_RETURN_ERROR(false);
  }
  if (V_count > VertexCapacity() || V_count > src_fragment.VertexCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_grid = grid;

  double* p = m_P;
  size_t p_stride = m_P_stride;
  const double* src_p = src_fragment.m_P;
  size_t src_p_stride = src_fragment.m_P_stride;
  const double* src_p1 = src_p + src_p_stride * src_V_count;
  if (V_count == src_V_count)
  {
    // Most common case where srf_fragment and target have the same density - faster way to copy.

    // copy m_P[]
    if (V_count <= this->PointCapacity())
    {
      while (src_p < src_p1)
      {
        p[0] = src_p[0];
        p[1] = src_p[1];
        p[2] = src_p[2];
        p += p_stride;
        src_p += src_p_stride;
      }
      m_surface_bbox = src_fragment.m_surface_bbox;
    }

    if (V_count <= this->NormalCapacity() )
    {
      if (V_count == src_fragment.NormalCount())
      {
        // copy m_N[]
        p = m_N;
        p_stride = m_N_stride;
        src_p = src_fragment.m_N;
        src_p_stride = src_fragment.m_N_stride;
        src_p1 = src_p + src_p_stride * src_V_count;
        while (src_p < src_p1)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += src_p_stride;
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_N, V_count, m_N_stride);
      }
    }

    if (V_count <= this->TextureCoordinateCapacity())
    {
      if (V_count == src_fragment.TextureCoordinateCount())
      {
        // copy m_T[]
        SetTextureCoordinatesExistForExperts(true);
        p = m_T;
        p_stride = m_T_stride;
        src_p = src_fragment.m_T;
        src_p_stride = src_fragment.m_T_stride;
        src_p1 = src_p + src_p_stride * src_V_count;
        while (src_p < src_p1)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += src_p_stride;
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_T, V_count, m_T_stride);
      }
    }

    if (V_count <= this->CurvatureCapacity())
    {
      if (V_count == src_fragment.CurvatureCount())
      {
        // copy m_K[]
        SetCurvaturesExistForExperts(true);
        ON_SurfaceCurvature* k = m_K;
        const size_t k_stride = m_K_stride;
        ON_SurfaceCurvature* src_k = src_fragment.m_K;
        size_t src_k_stride = src_fragment.m_K_stride;
        ON_SurfaceCurvature* src_k1 = src_k + src_k_stride * src_V_count;
        while (src_k < src_k1)
        {
          *k = *src_k;
          k += k_stride;
          src_k += src_k_stride;
        }
      }
      else
      {
        ON_SurfaceCurvature* k = m_K;
        for (ON_SurfaceCurvature* k1 = k + V_count * m_K_stride; k < k1; k += m_K_stride)
          *k = ON_SurfaceCurvature::Nan;
      }
    }

    if (V_count <= ColorCapacity())
    {
      if (V_count == src_fragment.ColorCount())
      {
        // copy m_C[]
        SetColorsExistForExperts(true);
        ON_Color* c = m_C;
        const size_t c_stride = m_C_stride;
        ON_Color* src_c = src_fragment.m_C;
        size_t src_c_stride = src_fragment.m_C_stride;
        ON_Color* src_c1 = src_c + src_c_stride * src_V_count;
        while (src_c < src_c1)
        {
          *c = *src_c;
          c += c_stride;
          src_c += src_c_stride;
        }
      }
      else
      {
        ON_Color* c = m_C;
        for (ON_Color* c1 = c + V_count * m_C_stride; c < c1; c += m_C_stride)
          *c = ON_Color::UnsetColor;
      }
    }
  }
  else
  {
    // src_fragment is more dense than target. Copy a subset of the points.
    //
    // This code appears to be rarely used. It is not well tested.
    //
    const unsigned int s0 = grid.SideSegmentCount();
    const unsigned int s1 = src_fragment.m_grid.SideSegmentCount();
    unsigned int x = 1;
    while (x*s0 < s1)
      x *= 2;
    const unsigned int m = src_fragment.m_grid.SidePointCount();
    const unsigned int di = src_fragment.m_grid.PointIndexFromGrid2dex(x, 0);
    const unsigned int dj = src_fragment.m_grid.PointIndexFromGrid2dex(0, x);

    // copy from src_fragment.m_P[] to this->m_P[]
    size_t i_stride = di * src_fragment.m_P_stride;
    size_t j_stride = m * dj * src_fragment.m_P_stride;

    if (V_count <= this->PointCapacity())
    {
      for (unsigned int j = 0; j < m; j += dj)
      {
        src_p = src_fragment.m_P + j * j_stride;
        for (unsigned int i = 0; i < m; i += di)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += i_stride;
        }
      }
      m_surface_bbox = src_fragment.m_surface_bbox;
    }

    if (V_count <= this->NormalCapacity())
    {
      // copy from src_fragment.m_N[] to this->m_N[]
      if (V_count <= src_fragment.NormalCount())
      {
        p = m_N;
        p_stride = m_N_stride;
        i_stride = di * src_fragment.m_N_stride;
        j_stride = m * dj * src_fragment.m_N_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          src_p = src_fragment.m_N + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            p[0] = src_p[0];
            p[1] = src_p[1];
            p[2] = src_p[2];
            p += p_stride;
            src_p += i_stride;
          }
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_N, V_count, m_N_stride);
      }
    }

    if (V_count <= this->TextureCoordinateCapacity())
    {
      // copy from src_fragment.m_T[] to this->m_T[]
      if (V_count <= src_fragment.TextureCoordinateCount())
      {
        SetTextureCoordinatesExistForExperts(true);
        p = m_T;
        p_stride = m_T_stride;
        i_stride = di * src_fragment.m_T_stride;
        j_stride = m * dj * src_fragment.m_T_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          src_p = src_fragment.m_T + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            p[0] = src_p[0];
            p[1] = src_p[1];
            p[2] = src_p[2];
            p += p_stride;
            src_p += i_stride;
          }
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_T, V_count, m_T_stride);
      }
    }

    if (V_count <= this->CurvatureCapacity())
    {
      // copy from src_fragment.m_K[] to this->m_K[]
      if (V_count <= src_fragment.CurvatureCount())
      {
        SetCurvaturesExistForExperts(true);
        ON_SurfaceCurvature* k = m_K;
        const size_t k_stride = m_K_stride;
        i_stride = di * src_fragment.m_K_stride;
        j_stride = m * dj * src_fragment.m_K_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          const ON_SurfaceCurvature* src_k = src_fragment.m_K + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            *k = *src_k;
            k += k_stride;
            src_k += i_stride;
          }
        }
      }
      else
      {
        ON_SurfaceCurvature* k = m_K;
        for (ON_SurfaceCurvature* k1 = k + V_count * m_K_stride; k < k1; k += m_K_stride)
          *k = ON_SurfaceCurvature::Nan;
      }
    }

    if (V_count <= this->ColorCapacity())
    {
      // copy from src_fragment.m_C[] to this->m_C[]
      if (V_count <= src_fragment.ColorCount())
      {
        SetColorsExistForExperts(true);
        ON_Color*c = m_C;
        const size_t c_stride = m_C_stride;
        i_stride = di * src_fragment.m_C_stride;
        j_stride = m * dj * src_fragment.m_C_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          const ON_Color* src_c = src_fragment.m_C + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            *c = *src_c;
            c += c_stride;
            src_c += i_stride;
          }
        }
      }
      else
      {
        ON_Color* c = m_C;
        for (ON_Color* c1 = c + V_count * m_C_stride; c < c1; c += m_C_stride)
          *c = ON_Color::UnsetColor;
      }
    }
  }

  SetVertexCount(V_count);

  return true;
}